

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O1

void kmpc_get_poolstat(size_t *maxmem,size_t *allmem)

{
  long lVar1;
  kmp_info_t *th;
  long lVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  
  iVar4 = __kmp_get_global_thread_id();
  th = __kmp_threads[iVar4];
  __kmp_bget_dequeue(th);
  lVar2 = *(long *)(th->th_pad + 0x120);
  sVar5 = 0;
  sVar6 = 0;
  lVar8 = 0;
  do {
    lVar1 = lVar2 + lVar8 * 0x30;
    lVar9 = lVar1;
    for (lVar3 = *(long *)(lVar2 + 0x20 + lVar8 * 0x30); lVar3 != lVar1;
        lVar3 = *(long *)(lVar3 + 0x20)) {
      if ((lVar9 == lVar1) || (*(long *)(lVar3 + 0x10) < *(long *)(lVar9 + 0x10))) {
        lVar9 = lVar3;
      }
      sVar6 = (sVar6 + *(long *)(lVar3 + 0x10)) - 0x20;
    }
    if ((long)sVar5 <= (long)*(size_t *)(lVar9 + 0x10)) {
      sVar5 = *(size_t *)(lVar9 + 0x10);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x14);
  sVar7 = sVar5 - 0x20;
  if ((long)sVar5 < 0x21) {
    sVar7 = sVar5;
  }
  *maxmem = sVar7;
  *allmem = sVar6;
  return;
}

Assistant:

void kmpc_get_poolstat(size_t *maxmem, size_t *allmem) {
  kmp_info_t *th = __kmp_get_thread();
  bufsize a, b;

  __kmp_bget_dequeue(th); /* Release any queued buffers */

  bcheck(th, &a, &b);

  *maxmem = a;
  *allmem = b;
}